

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void OpenSteer::deferredDrawLine(Vec3 *startPoint,Vec3 *endPoint,Color *color)

{
  undefined4 uVar2;
  pointer pDVar1;
  pointer *ppDVar3;
  pointer pDVar4;
  pointer pDVar5;
  pointer *this;
  _Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
  *p_Var6;
  ulong uVar7;
  ulong uVar8;
  pointer *ppDVar9;
  pointer *ppDVar10;
  ulong uVar11;
  undefined8 uStack_50;
  pointer pDStack_40;
  pointer pDStack_38;
  
  Color::Color((Color *)&pDStack_40);
  p_Var6 = (_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
            *)DAT_00177c28;
  this = (anonymous_namespace)::DeferredLine::lines;
  uVar2 = startPoint->z;
  pDVar4 = *(pointer *)startPoint;
  uStack_50 = (pointer)CONCAT44(endPoint->x,uVar2);
  pDVar1 = *(pointer *)&endPoint->y;
  pDStack_40 = *(pointer *)color;
  pDStack_38 = *(pointer *)&color->b_;
  if (DAT_00177c28 == DAT_00177c30) {
    if ((long)DAT_00177c28 - (long)(anonymous_namespace)::DeferredLine::lines == 0x7ffffffffffffff8)
    {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar7 = ((long)DAT_00177c28 - (long)(anonymous_namespace)::DeferredLine::lines) / 0x28;
    uVar8 = 1;
    if (DAT_00177c28 != (anonymous_namespace)::DeferredLine::lines) {
      uVar8 = uVar7;
    }
    uVar11 = uVar8 + uVar7;
    if (0x333333333333332 < uVar11) {
      uVar11 = 0x333333333333333;
    }
    if (CARRY8(uVar8,uVar7)) {
      uVar11 = 0x333333333333333;
    }
    if (uVar11 == 0) {
      ppDVar9 = (pointer *)0x0;
    }
    else {
      ppDVar9 = (pointer *)operator_new(uVar11 * 0x28);
    }
    ppDVar9[uVar7 * 5 + 4] = pDStack_38;
    ppDVar9[uVar7 * 5 + 2] = pDVar1;
    (ppDVar9 + uVar7 * 5 + 2)[1] = pDStack_40;
    ppDVar9[uVar7 * 5] = pDVar4;
    (ppDVar9 + uVar7 * 5)[1] = uStack_50;
    ppDVar3 = ppDVar9;
    for (ppDVar10 = this;
        (_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
         *)ppDVar10 != p_Var6; ppDVar10 = ppDVar10 + 5) {
      ppDVar3[4] = ppDVar10[4];
      pDVar1 = *ppDVar10;
      pDVar4 = ppDVar10[1];
      pDVar5 = (((_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
                  *)(ppDVar10 + 3))->_M_impl).super__Vector_impl_data._M_start;
      ppDVar3[2] = ppDVar10[2];
      ppDVar3[3] = pDVar5;
      *ppDVar3 = pDVar1;
      ppDVar3[1] = pDVar4;
      ppDVar3 = ppDVar3 + 5;
    }
    std::
    _Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
    ::_M_deallocate((_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
                     *)this,(pointer)(((long)DAT_00177c30 - (long)this) / 0x28),
                    ((long)DAT_00177c30 - (long)this) % 0x28);
    DAT_00177c30 = ppDVar9 + uVar11 * 5;
    (anonymous_namespace)::DeferredLine::lines = ppDVar9;
    DAT_00177c28 = ppDVar3 + 5;
  }
  else {
    (((_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
       *)((long)DAT_00177c28 + 0x18))->_M_impl).super__Vector_impl_data._M_finish = pDStack_38;
    (((_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
       *)DAT_00177c28)->_M_impl).super__Vector_impl_data._M_end_of_storage = pDVar1;
    (((_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
       *)((long)DAT_00177c28 + 0x18))->_M_impl).super__Vector_impl_data._M_start = pDStack_40;
    (((_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
       *)DAT_00177c28)->_M_impl).super__Vector_impl_data._M_start = pDVar4;
    (((_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
       *)DAT_00177c28)->_M_impl).super__Vector_impl_data._M_finish = uStack_50;
    DAT_00177c28 = &(((_Vector_base<(anonymous_namespace)::DeferredLine,_std::allocator<(anonymous_namespace)::DeferredLine>_>
                       *)((long)DAT_00177c28 + 0x18))->_M_impl).super__Vector_impl_data.
                    _M_end_of_storage;
  }
  return;
}

Assistant:

void 
OpenSteer::deferredDrawLine (const Vec3& startPoint,
                             const Vec3& endPoint,
                             const Color& color)
{
    DeferredLine::addToBuffer (startPoint, endPoint, color);
}